

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sDrawTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::InvalidDrawCase::iterate(InvalidDrawCase *this)

{
  InvalidOperation IVar1;
  RenderContext *renderCtx;
  int iVar2;
  GLuint index;
  GLuint index_00;
  GLenum GVar3;
  undefined4 extraout_var;
  uint uVar4;
  GLsizeiptr size;
  size_type __n;
  ulong uVar5;
  short sVar6;
  long lVar7;
  CallLogWrapper gl;
  DrawArraysCommand drawCommand;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ShaderProgram program;
  CallLogWrapper local_328;
  uint local_310;
  undefined4 local_30c;
  value_type local_308;
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  uint local_2a8;
  value_type local_2a0;
  undefined1 local_280 [8];
  int local_278;
  undefined4 uStack_274;
  pointer local_270;
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram local_100;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_328,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(local_280,0,0xac);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_310 = 0;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_2e8,local_2e0 + (long)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (ulong)local_310 * 0x18),&local_308);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nin highp vec4 v_color;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  local_2a8 = 1;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_2c8,local_2c0 + (long)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (ulong)local_2a8 * 0x18),&local_2a0);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  index = glu::CallLogWrapper::glGetAttribLocation
                    (&local_328,local_100.m_program.m_program,"a_position");
  index_00 = glu::CallLogWrapper::glGetAttribLocation
                       (&local_328,local_100.m_program.m_program,"a_color");
  local_328.m_enableLog = true;
  glu::CallLogWrapper::glGenVertexArrays(&local_328,1,&this->m_vao);
  glu::CallLogWrapper::glBindVertexArray(&local_328,this->m_vao);
  GVar3 = glu::CallLogWrapper::glGetError(&local_328);
  glu::checkError(GVar3,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xbf);
  if (this->m_drawType == DRAW_ELEMENTS) {
    __n = 10000;
    if (this->m_op == INVALID_INDEX_COUNT) {
      __n = 10;
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_280,__n,
               (allocator_type *)&local_310);
    uVar4 = (uint)((ulong)(CONCAT44(uStack_274,local_278) - (long)local_280) >> 1);
    if (0 < (int)uVar4) {
      IVar1 = this->m_op;
      uVar5 = 0;
      do {
        sVar6 = (short)uVar5 + 10000;
        if (IVar1 != INVALID_INDEX) {
          sVar6 = (short)uVar5;
        }
        *(short *)((long)&((_Alloc_hider *)local_280)->_M_p + uVar5 * 2) = sVar6;
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
    glu::CallLogWrapper::glGenBuffers(&local_328,1,&this->m_indexBufferID);
    glu::CallLogWrapper::glBindBuffer(&local_328,0x8893,this->m_indexBufferID);
    glu::CallLogWrapper::glBufferData
              (&local_328,0x8893,(long)(local_278 - local_280._0_4_) & 0xfffffffffffffffe,
               (void *)local_280,0x88e4);
    GVar3 = glu::CallLogWrapper::glGetError(&local_328);
    glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xcd);
    if (local_280 != (undefined1  [8])0x0) {
      operator_delete((void *)local_280,(long)local_270 - (long)local_280);
    }
  }
  IVar1 = this->m_op;
  glu::CallLogWrapper::glGenBuffers(&local_328,1,&this->m_dataBufferID);
  glu::CallLogWrapper::glBindBuffer(&local_328,0x8892,this->m_dataBufferID);
  size = 160000;
  if (IVar1 == INVALID_DATA_COUNT) {
    size = 0xa0;
  }
  glu::CallLogWrapper::glBufferData(&local_328,0x8892,size,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(&local_328,index,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_328,index);
  GVar3 = glu::CallLogWrapper::glGetError(&local_328);
  glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xda);
  glu::CallLogWrapper::glGenBuffers(&local_328,1,&this->m_colorBufferID);
  glu::CallLogWrapper::glBindBuffer(&local_328,0x8892,this->m_colorBufferID);
  glu::CallLogWrapper::glBufferData(&local_328,0x8892,0x10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glVertexAttribPointer(&local_328,index_00,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_328,index_00);
  glu::CallLogWrapper::glVertexAttribDivisor(&local_328,index_00,1);
  GVar3 = glu::CallLogWrapper::glGetError(&local_328);
  glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                  ,0xe7);
  if (this->m_drawType == DRAW_ELEMENTS) {
    local_310 = 10000;
    IVar1 = this->m_op;
    local_30c = 1;
    if (IVar1 == INVALID_DATA_INSTANCED) {
      local_30c = 1000;
    }
    local_308._M_dataplus._M_p._4_4_ = 0;
    local_308._M_dataplus._M_p._0_4_ = 0;
    if (IVar1 == INVALID_INDEX_FIRST) {
      local_308._M_dataplus._M_p._0_4_ = 10000;
    }
    if (IVar1 == INVALID_DATA_FIRST) {
      local_308._M_dataplus._M_p._4_4_ = 10000;
    }
    local_308._M_string_length._0_4_ = (uint)(IVar1 == INVALID_RESERVED) * 5;
    local_280 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"drawCommand:",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tcount:\t",9);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tprimCount\t",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tfirstIndex\t",0xd)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tbaseVertex\t",0xd)
    ;
    std::ostream::operator<<((ostringstream *)&local_278,local_308._M_dataplus._M_p._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"\n\treservedMustBeZero\t",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
    std::ios_base::~ios_base(local_208);
    glu::CallLogWrapper::glGenBuffers(&local_328,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer(&local_328,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData(&local_328,0x8f3f,0x14,&local_310,0x88e4);
    GVar3 = glu::CallLogWrapper::glGetError(&local_328);
    glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0x117);
  }
  else if (this->m_drawType == DRAW_ARRAYS) {
    local_310 = 10000;
    IVar1 = this->m_op;
    local_30c = 1;
    if (IVar1 == INVALID_DATA_INSTANCED) {
      local_30c = 1000;
    }
    local_308._M_dataplus._M_p._0_4_ = 0;
    if (IVar1 == INVALID_DATA_FIRST) {
      local_308._M_dataplus._M_p._0_4_ = 10000;
    }
    local_308._M_dataplus._M_p._4_4_ = (uint)(IVar1 == INVALID_RESERVED) * 5;
    local_280 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"drawCommand:",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tcount:\t",9);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tprimCount\t",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"\n\tfirst\t",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"\n\treservedMustBeZero\t",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
    std::ios_base::~ios_base(local_208);
    glu::CallLogWrapper::glGenBuffers(&local_328,1,&this->m_cmdBufferID);
    glu::CallLogWrapper::glBindBuffer(&local_328,0x8f3f,this->m_cmdBufferID);
    glu::CallLogWrapper::glBufferData(&local_328,0x8f3f,0x10,&local_310,0x88e4);
    GVar3 = glu::CallLogWrapper::glGetError(&local_328);
    glu::checkError(GVar3,glcts::fixed_sample_locations_values + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sDrawTests.cpp"
                    ,0xff);
  }
  glu::CallLogWrapper::glViewport(&local_328,0,0,1,1);
  glu::CallLogWrapper::glUseProgram(&local_328,local_100.m_program.m_program);
  if (this->m_drawType == DRAW_ARRAYS) {
    glu::CallLogWrapper::glDrawArraysIndirect(&local_328,4,(void *)0x0);
  }
  else if (this->m_drawType == DRAW_ELEMENTS) {
    glu::CallLogWrapper::glDrawElementsIndirect(&local_328,4,0x1403,(void *)0x0);
  }
  glu::CallLogWrapper::glUseProgram(&local_328,0);
  glu::CallLogWrapper::glFinish(&local_328);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ShaderProgram::~ShaderProgram(&local_100);
  glu::CallLogWrapper::~CallLogWrapper(&local_328);
  return STOP;
}

Assistant:

InvalidDrawCase::IterateResult InvalidDrawCase::iterate (void)
{
	const int drawCount				= 10;		//!< number of elements safe to draw (all buffers have this)
	const int overBoundDrawCount	= 10000;	//!< number of elements in all other buffers than our target buffer
	const int drawInstances			= 1;
	const int overBoundInstances	= 1000;

	glu::CallLogWrapper gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_colorVertexShaderSource) << glu::FragmentSource(s_colorFragmentShaderSource));
	const deUint32		programID		= program.getProgram();
	const deInt32		posLocation		= gl.glGetAttribLocation(programID, "a_position");
	const deInt32		colorLocation	= gl.glGetAttribLocation(programID, "a_color");

	gl.enableLogging(true);

	gl.glGenVertexArrays(1, &m_vao);
	gl.glBindVertexArray(m_vao);
	glu::checkError(gl.glGetError(), "gen vao", __FILE__, __LINE__);

	// indices
	if (m_drawType == DRAW_ELEMENTS)
	{
		const int				indexBufferSize = (m_op == INVALID_INDEX_COUNT) ? (drawCount) : (overBoundDrawCount);
		std::vector<deUint16>	indices			(indexBufferSize);

		for (int ndx = 0; ndx < (int)indices.size(); ++ndx)
			indices[ndx] = (deUint16)((m_op == INVALID_INDEX) ? (overBoundDrawCount + ndx) : (ndx));

		gl.glGenBuffers(1, &m_indexBufferID);
		gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBufferID);
		gl.glBufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size() * sizeof(deUint16)), &indices[0], GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// data
	{
		const int dataSize = (m_op == INVALID_DATA_COUNT) ? (drawCount) : (overBoundDrawCount);

		// any data is ok
		gl.glGenBuffers(1, &m_dataBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_dataBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(posLocation);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// potentially instanced data
	{
		const int dataSize = drawInstances;

		gl.glGenBuffers(1, &m_colorBufferID);
		gl.glBindBuffer(GL_ARRAY_BUFFER, m_colorBufferID);
		gl.glBufferData(GL_ARRAY_BUFFER, dataSize * sizeof(float[4]), DE_NULL, GL_STATIC_DRAW);
		gl.glVertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		gl.glEnableVertexAttribArray(colorLocation);
		gl.glVertexAttribDivisor(colorLocation, 1);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}

	// command
	if (m_drawType == DRAW_ARRAYS)
	{
		DrawArraysCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.first				= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirst\t" << drawCommand.first
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else if (m_drawType == DRAW_ELEMENTS)
	{
		DrawElementsCommand drawCommand;
		drawCommand.count				= overBoundDrawCount;
		drawCommand.primCount			= (m_op == INVALID_DATA_INSTANCED)	? (overBoundInstances)	: (drawInstances);
		drawCommand.firstIndex			= (m_op == INVALID_INDEX_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.baseVertex			= (m_op == INVALID_DATA_FIRST)		? (overBoundDrawCount)	: (0);
		drawCommand.reservedMustBeZero	= (m_op == INVALID_RESERVED)		? (5)					: (0);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "drawCommand:"
			<< "\n\tcount:\t" << drawCommand.count
			<< "\n\tprimCount\t" << drawCommand.primCount
			<< "\n\tfirstIndex\t" << drawCommand.firstIndex
			<< "\n\tbaseVertex\t" << drawCommand.baseVertex
			<< "\n\treservedMustBeZero\t" << drawCommand.reservedMustBeZero
			<< tcu::TestLog::EndMessage;

		gl.glGenBuffers(1, &m_cmdBufferID);
		gl.glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(drawCommand), &drawCommand, GL_STATIC_DRAW);
		glu::checkError(gl.glGetError(), "", __FILE__, __LINE__);
	}
	else
		DE_ASSERT(DE_FALSE);

	gl.glViewport(0, 0, 1, 1);
	gl.glUseProgram(programID);

	if (m_drawType == DRAW_ELEMENTS)
		gl.glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, DE_NULL);
	else if (m_drawType == DRAW_ARRAYS)
		gl.glDrawArraysIndirect(GL_TRIANGLES, DE_NULL);
	else
		DE_ASSERT(DE_FALSE);

	gl.glUseProgram(0);
	gl.glFinish();

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}